

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

RawClassRef stackjit::Runtime::newString(char *string,int length)

{
  GarbageCollector *pGVar1;
  ArrayType *arrayType;
  RawArrayRef value;
  ClassType *classType;
  RawClassRef stringRef;
  ulong uVar2;
  
  pGVar1 = VMState::gc(Internal::vmState);
  arrayType = StringRef::charArrayType();
  value = GarbageCollector::newArray(pGVar1,arrayType,length);
  if (0 < length) {
    uVar2 = 0;
    do {
      value[uVar2 + 4] = string[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
  }
  pGVar1 = VMState::gc(Internal::vmState);
  classType = StringRef::stringType();
  stringRef = GarbageCollector::newClass(pGVar1,classType);
  StringRef::setCharsField(stringRef,(char *)value);
  return stringRef;
}

Assistant:

RawClassRef Runtime::newString(const char* string, int length) {
		//Allocate the underlying char array
		auto charsPtr = vmState()->gc().newArray(StringRef::charArrayType(), length);

		//Set the value for the char array
		for (int i = 0; i < length; i++) {
			charsPtr[i + stackjit::ARRAY_LENGTH_SIZE] = (unsigned char)string[i];
		}

		//Allocate the string object
		auto stringPr = vmState()->gc().newClass(StringRef::stringType());

		//Set the chars field
		StringRef::setCharsField(stringPr, (char*)charsPtr);
		return stringPr;
	}